

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O2

void __thiscall
TEST_MockParameterTest_newCallStartsWhileNotAllParametersWerePassed_Test::testBody
          (TEST_MockParameterTest_newCallStartsWhileNotAllParametersWerePassed_Test *this)

{
  int iVar1;
  MockCheckedExpectedCall *pMVar2;
  UtestShell *test;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MockFailureReporterInstaller failureReporterInstaller;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  MockExpectedCallsListForTest expectations;
  MockExpectedParameterDidntHappenFailure expectedFailure;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&failureReporterInstaller);
  MockExpectedCallsListForTest::MockExpectedCallsListForTest(&expectations);
  SimpleString::SimpleString((SimpleString *)&expectedFailure,"foo");
  pMVar2 = MockExpectedCallsListForTest::addFunction(&expectations,(SimpleString *)&expectedFailure)
  ;
  SimpleString::SimpleString(&local_b0,"p1");
  (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[0xb])(pMVar2,&local_b0,1);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString((SimpleString *)&expectedFailure);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_b0,"foo");
  MockExpectedParameterDidntHappenFailure::MockExpectedParameterDidntHappenFailure
            (&expectedFailure,test,&local_b0,&expectations.super_MockExpectedCallsList,
             &expectations.super_MockExpectedCallsList);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_b0,"");
  pMVar3 = mock(&local_b0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_a0);
  SimpleString::SimpleString(&local_90,"p1");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x58))
            ((long *)CONCAT44(extraout_var,iVar1),&local_90,1);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_b0,"");
  pMVar3 = mock(&local_b0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"foo");
  (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_a0);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_b0,"");
  pMVar3 = mock(&local_b0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_a0);
  SimpleString::SimpleString(&local_90,"p1");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x40))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_90,1);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_b0);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            (&expectedFailure.super_MockFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
             ,0x26e);
  TestFailure::~TestFailure((TestFailure *)&expectedFailure);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest(&expectations);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&failureReporterInstaller);
  return;
}

Assistant:

TEST(MockParameterTest, newCallStartsWhileNotAllParametersWerePassed)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withParameter("p1", 1);
    MockExpectedParameterDidntHappenFailure expectedFailure(mockFailureTest(), "foo", expectations, expectations);

    mock().expectOneCall("foo").withParameter("p1", 1);
    mock().actualCall("foo");
    mock().actualCall("foo").withParameter("p1", 1);

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}